

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_cast.hpp
# Opt level: O0

uint libtorrent::aux::numeric_cast<unsigned_int,unsigned_short,void>(unsigned_short v)

{
  uint r;
  unsigned_short v_local;
  
  return (uint)v;
}

Assistant:

T numeric_cast(In v)
	{
		T r = static_cast<T>(v);
		TORRENT_ASSERT(v == static_cast<In>(r));
		TORRENT_ASSERT(std::is_unsigned<In>::value || std::is_signed<T>::value
			|| std::int64_t(v) >= 0);
		TORRENT_ASSERT(std::is_signed<In>::value || std::is_unsigned<T>::value
			|| std::size_t(v) <= std::size_t((std::numeric_limits<T>::max)()));
		return r;
	}